

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metro_exodus.cpp
# Opt level: O1

bool __thiscall
uGraph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::check
          (uGraph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *src,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *des)

{
  _List_node_base *p_Var1;
  _List_node_base *__n;
  int iVar2;
  uint uVar3;
  _List_node_base *p_Var4;
  uint uVar5;
  
  p_Var4 = (this->path).
           super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  uVar3 = 0;
  if (p_Var4 != (_List_node_base *)&this->path) {
    p_Var1 = (_List_node_base *)src->_M_string_length;
    do {
      __n = p_Var4[1]._M_prev;
      if (__n == p_Var1) {
        uVar5 = 1;
        if (__n != (_List_node_base *)0x0) {
          iVar2 = bcmp(p_Var4[1]._M_next,(src->_M_dataplus)._M_p,(size_t)__n);
          if (iVar2 != 0) goto LAB_0010ab18;
        }
      }
      else {
LAB_0010ab18:
        uVar5 = 0;
        if (__n == (_List_node_base *)des->_M_string_length) {
          if (__n == (_List_node_base *)0x0) {
            uVar5 = 1;
          }
          else {
            iVar2 = bcmp(p_Var4[1]._M_next,(des->_M_dataplus)._M_p,(size_t)__n);
            uVar5 = (uint)(iVar2 == 0);
          }
        }
      }
      uVar3 = uVar3 + uVar5;
      p_Var4 = p_Var4->_M_next;
    } while (p_Var4 != (_List_node_base *)&this->path);
    uVar3 = (uint)(uVar3 == 2);
  }
  return SUB41(uVar3,0);
}

Assistant:

bool check(ver src, ver des) {//check if path is possible
      int f = 0;
      for (auto &v : path)
        f += v == src || v == des;
      return f == 2;
    }